

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O0

void __thiscall
tcu::TestNode::getChildren
          (TestNode *this,vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *res)

{
  size_type sVar1;
  reference __x;
  int local_1c;
  int i;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *res_local;
  TestNode *this_local;
  
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::clear(res);
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size(&this->m_children);
    if ((int)sVar1 <= local_1c) break;
    __x = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                    (&this->m_children,(long)local_1c);
    std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back(res,__x);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void TestNode::getChildren (vector<TestNode*>& res)
{
	res.clear();
	for (int i = 0; i < (int)m_children.size(); i++)
		res.push_back(m_children[i]);
}